

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.cpp
# Opt level: O1

bool __thiscall function::hasSameName(function *this,string *varName)

{
  pointer pcVar1;
  _Alloc_hider _Var2;
  int iVar3;
  const_iterator cVar4;
  size_type sVar5;
  string name;
  key_type local_48;
  
  pcVar1 = (varName->_M_dataplus)._M_p;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar1,pcVar1 + varName->_M_string_length);
  _Var2._M_p = local_48._M_dataplus._M_p;
  if (local_48._M_string_length != 0) {
    sVar5 = 0;
    do {
      iVar3 = tolower((int)_Var2._M_p[sVar5]);
      _Var2._M_p[sVar5] = (char)iVar3;
      sVar5 = sVar5 + 1;
    } while (local_48._M_string_length != sVar5);
  }
  cVar4 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&(this->sameName)._M_t,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return (_Rb_tree_header *)cVar4._M_node != &(this->sameName)._M_t._M_impl.super__Rb_tree_header;
}

Assistant:

bool function::hasSameName(const string &varName) {
    string name=varName;
    transform(name.begin(), name.end(), name.begin(), ::tolower);
    return sameName.count(name) > 0;
}